

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainILR.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  string local_98;
  string local_78;
  AST local_58;
  AST ast;
  allocator<char> local_39;
  string local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  filename.field_2._8_8_ = argv;
  this = std::operator<<((ostream *)&std::cout,"Hello, World!");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"vbn/tim.cpp",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&local_78,local_38);
  AST::AST(&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator=(local_38,"output/parsed.dot");
  std::__cxx11::string::string((string *)&local_98,local_38);
  AST::toDot(&local_58,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    std::cout << "Hello, World!" << std::endl;

    std::string filename = "vbn/tim.cpp";
    AST ast(filename);

    filename = "output/parsed.dot";
    ast.toDot(filename);
}